

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

bool ON_IsKnotVectorUniform(int order,int cv_count,double *knot)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  int local_5c;
  int local_58;
  double d;
  int i;
  double delta_tol;
  double k0;
  int i1;
  int i0;
  double delta;
  bool rc;
  double *knot_local;
  int cv_count_local;
  int order_local;
  
  bVar2 = false;
  if ((1 < order) && (bVar2 = false, order <= cv_count)) {
    bVar2 = knot != (double *)0x0;
  }
  if (bVar2) {
    dVar3 = knot[order + -1] - knot[order + -2];
    bVar2 = false;
    if (((dVar3 != 0.0) || (NAN(dVar3))) && (bVar2 = false, -1.23432101234321e+308 < dVar3)) {
      bVar2 = dVar3 < 1.23432101234321e+308;
    }
    if (bVar2) {
      bVar1 = ON_IsKnotVectorClamped(order,cv_count,knot,0);
      local_58 = order;
      if (!bVar1) {
        local_58 = 1;
      }
      bVar1 = ON_IsKnotVectorClamped(order,cv_count,knot,1);
      local_5c = cv_count;
      if (!bVar1) {
        local_5c = ON_KnotCount(order,cv_count);
      }
      delta_tol = knot[local_58 + -1];
      d._4_4_ = local_58;
      while( true ) {
        bVar1 = false;
        if (d._4_4_ < local_5c) {
          bVar1 = bVar2;
        }
        if (bVar1 == false) break;
        bVar2 = ABS((knot[d._4_4_] - delta_tol) - dVar3) <= ABS(dVar3 * 1.490116119385e-08);
        delta_tol = knot[d._4_4_];
        d._4_4_ = d._4_4_ + 1;
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_IsKnotVectorUniform(
          int order,
          int cv_count,
          const double* knot 
          )
{
  bool rc = (order >= 2 && cv_count >= order && 0 != knot);
  if (rc)
  {
    const double delta = knot[order-1] - knot[order-2];
    rc = (0.0 != delta && delta > ON_UNSET_VALUE && delta < ON_UNSET_POSITIVE_VALUE);
    if (rc)
    {
      const int i0 = ON_IsKnotVectorClamped(order, cv_count, knot, 0) ? order : 1;
      const int i1 = ON_IsKnotVectorClamped(order, cv_count, knot, 1) ? cv_count : ON_KnotCount(order, cv_count);
      double k0 = knot[i0 - 1];
      const double delta_tol = fabs(ON_SQRT_EPSILON*delta);
      for (int i = i0; i < i1 && rc; ++i)
      {
        const double d = knot[i] - k0;
        rc = fabs(d - delta) <= delta_tol;
        k0 = knot[i];
      }
    }
  }
  return rc;
}